

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O2

REF_STATUS ref_validation_boundary_at_node(REF_GRID ref_grid,REF_INT node)

{
  int iVar1;
  REF_CELL ref_cell;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  REF_NODE pRVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  REF_INT cell;
  ulong uVar9;
  long lVar10;
  REF_INT ncell;
  REF_NODE local_158;
  ulong local_150;
  REF_INT cell_list [10];
  REF_INT ns [27];
  REF_INT nodes [27];
  
  ref_cell = ref_grid->cell[3];
  uVar9 = 0xffffffff;
  cell = -1;
  if (-1 < node) {
    pRVar2 = ref_cell->ref_adj;
    uVar9 = 0xffffffff;
    cell = -1;
    if (node < pRVar2->nnode) {
      uVar5 = pRVar2->first[(uint)node];
      uVar9 = 0xffffffff;
      cell = -1;
      if ((long)(int)uVar5 != -1) {
        cell = pRVar2->item[(int)uVar5].ref;
        uVar9 = (ulong)uVar5;
      }
    }
  }
  local_158 = ref_grid->node;
  do {
    if ((int)uVar9 == -1) {
      return 0;
    }
    uVar5 = ref_cell_nodes(ref_cell,cell,nodes);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
             0x68,"ref_validation_boundary_at_node",(ulong)uVar5,"get cell");
      return uVar5;
    }
    local_150 = uVar9;
    for (lVar10 = 0; lVar10 < ref_cell->edge_per; lVar10 = lVar10 + 1) {
      lVar8 = (long)ref_cell->size_per * (long)cell;
      uVar5 = ref_cell->c2n[ref_cell->e2n[lVar10 * 2] + lVar8];
      uVar7 = ref_cell->c2n[(long)(int)lVar8 + (long)ref_cell->e2n[lVar10 * 2 + 1]];
      iVar1 = local_158->ref_mpi->id;
      if ((iVar1 == local_158->part[(int)uVar5]) || (iVar1 == local_158->part[(int)uVar7])) {
        uVar6 = ref_cell_list_with2(ref_cell,uVar5,uVar7,10,&ncell,cell_list);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0x73,"ref_validation_boundary_at_node",(ulong)uVar6,
                 "more than ten triangles found with two nodes");
          printf("nodes %d %d faceid %d\n",(ulong)uVar5,(ulong)uVar7,(ulong)(uint)nodes[3]);
          pRVar4 = local_158;
          ref_node_location(local_158,uVar5);
          ref_node_location(pRVar4,uVar7);
          return uVar6;
        }
        lVar8 = (long)ncell;
        if (lVar8 != 2) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0x7e,"ref_validation_boundary_at_node","two triangles expected",2,lVar8);
          printf("nodes %d %d faceid %d\n",(ulong)uVar5,(ulong)uVar7,(ulong)(uint)nodes[3]);
          pRVar4 = local_158;
          ref_node_location(local_158,uVar5);
          ref_node_location(pRVar4,uVar7);
          uVar9 = 0;
          while( true ) {
            if ((long)ncell <= (long)uVar9) {
              return 1;
            }
            uVar5 = cell_list[uVar9];
            uVar7 = ref_cell_nodes(ref_cell,uVar5,ns);
            if (uVar7 != 0) break;
            lVar8 = CONCAT44((int)((ulong)lVar8 >> 0x20),ns[3]);
            printf(" item %d cell %d nodes %d %d %d id %d\n",uVar9 & 0xffffffff,(ulong)uVar5,
                   (ulong)(uint)ns[0],(ulong)(uint)ns[1],(ulong)(uint)ns[2],lVar8);
            uVar9 = uVar9 + 1;
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0x7a,"ref_validation_boundary_at_node",(ulong)uVar7,"get cell",lVar8);
          return uVar7;
        }
      }
    }
    pRVar3 = ref_cell->ref_adj->item;
    uVar9 = (ulong)pRVar3[(int)local_150].next;
    cell = -1;
    if (uVar9 != 0xffffffffffffffff) {
      cell = pRVar3[uVar9].ref;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_validation_boundary_at_node(REF_GRID ref_grid,
                                                   REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell, cell_edge, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT i, c, ns[REF_CELL_MAX_SIZE_PER];
  REF_INT node0, node1, ncell, cell_list[10];

  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "get cell");
    each_ref_cell_cell_edge(ref_cell, cell_edge) {
      node0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
      node1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
      if (!ref_node_owned(ref_node, node0) && !ref_node_owned(ref_node, node1))
        continue;
      RSB(ref_cell_list_with2(ref_cell, node0, node1, 10, &ncell, cell_list),
          "more than ten triangles found with two nodes", {
            printf("nodes %d %d faceid %d\n", node0, node1, nodes[3]);
            ref_node_location(ref_node, node0);
            ref_node_location(ref_node, node1);
          });
      REIB(2, ncell, "two triangles expected", {
        printf("nodes %d %d faceid %d\n", node0, node1, nodes[3]);
        ref_node_location(ref_node, node0);
        ref_node_location(ref_node, node1);
        for (i = 0; i < ncell; i++) {
          c = cell_list[i];
          RSS(ref_cell_nodes(ref_cell, c, ns), "get cell");
          printf(" item %d cell %d nodes %d %d %d id %d\n", i, c, ns[0], ns[1],
                 ns[2], ns[3]);
        }
      });
    }
  }

  return REF_SUCCESS;
}